

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O2

void __thiscall Spi::check_rx(Spi *this)

{
  uint in_EAX;
  int iVar1;
  ostream *poVar2;
  BYTE byInputBuffer [1];
  ulong uStack_38;
  DWORD dwNumBytesRead;
  
  uStack_38 = (ulong)in_EAX;
  while( true ) {
    iVar1 = FT_Read(this->ftHandle,byInputBuffer,1,&dwNumBytesRead);
    if (iVar1 != 0) break;
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unexpected rx byte: ");
    poVar2 = std::operator<<(poVar2,byInputBuffer[0]);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void Spi::check_rx() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;

	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK)
			break;
		cerr << "Unexpected rx byte: " << byInputBuffer[0] << endl;
	}
}